

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O2

void __thiscall
chrono::ChCoordsys<double>::ArchiveOUT(ChCoordsys<double> *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChQuaternion<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChCoordsys<double>>(marchive);
  local_30._name = "pos";
  local_30._flags = '\0';
  local_30._value = &this->pos;
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->rot;
  local_48._name = "rot";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ArchiveOUT(ChArchiveOut& marchive) {
        // suggested: use versioning
        marchive.VersionWrite<ChCoordsys<double>>();
        // stream out all member data
        marchive << CHNVP(pos);
        marchive << CHNVP(rot);
    }